

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O3

void __thiscall wasm::Fuzzer::run(Fuzzer *this,uint64_t seed)

{
  pointer pcVar1;
  pointer pcVar2;
  value_type *__val;
  long lVar3;
  ostream *poVar4;
  result_type rVar5;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  uint64_t uVar6;
  size_t i;
  ulong uVar7;
  undefined1 local_bf0 [8];
  RandEngine getRand;
  pointer pcStack_220;
  pointer local_218;
  size_t local_210;
  undefined8 uStack_208;
  uint32_t local_200;
  undefined1 local_98 [8];
  HeapTypeGenerator generator;
  ErrorReason local_58;
  byte local_48;
  vector<char,_std::allocator<char>_> local_40;
  
  lVar3 = 1;
  uVar6 = seed;
  do {
    uVar6 = (uVar6 >> 0x3e ^ uVar6) * 0x5851f42d4c957f2d + lVar3;
    getRand._M_x[lVar3 + -1] = uVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x138);
  getRand._M_x[0x137] = 0x138;
  local_bf0 = (undefined1  [8])seed;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running with seed ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)operator_new(0x1000);
  pcVar1 = local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start + 0x1000;
  uVar7 = 0;
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar1;
  memset(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,0,0x1000);
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = pcVar1;
  do {
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_bf0);
    *(result_type *)
     (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start + uVar7) = rVar5;
    uVar7 = uVar7 + 8;
  } while (uVar7 < (ulong)((long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start));
  Random::Random((Random *)&getRand._M_p,&local_40,(FeatureSet)0x3fffff);
  pcVar1 = (this->rand).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->rand).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->rand).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)getRand._M_p;
  (this->rand).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_finish = pcStack_220;
  (this->rand).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)local_218;
  getRand._M_p = 0;
  local_218 = (pointer)0x0;
  if (pcVar1 == (pointer)0x0) {
    (this->rand).features.features = local_200;
    (this->rand).pos = local_210;
    (this->rand).finishedInput = (bool)(undefined1)uStack_208;
    *(undefined3 *)&(this->rand).field_0x21 = uStack_208._1_3_;
    (this->rand).xorFactor = uStack_208._4_4_;
  }
  else {
    operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
    (this->rand).features.features = local_200;
    (this->rand).pos = local_210;
    (this->rand).finishedInput = (bool)(undefined1)uStack_208;
    *(undefined3 *)&(this->rand).field_0x21 = uStack_208._1_3_;
    (this->rand).xorFactor = uStack_208._4_4_;
    if (getRand._M_p != 0) {
      operator_delete((void *)getRand._M_p,(long)local_218 - getRand._M_p);
    }
  }
  HeapTypeGenerator::create((HeapTypeGenerator *)local_98,&this->rand,(FeatureSet)0x3fffff,0x14);
  wasm::TypeBuilder::build();
  if (local_48 != 1) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&generator.supertypeIndices.
                         super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=(&this->types,__x);
    local_218 = (this->subtypeIndices).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->subtypeIndices).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         generator.subtypeIndices.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    getRand._M_p = (size_t)(this->subtypeIndices).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    (this->subtypeIndices).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)generator._0_8_;
    (this->subtypeIndices).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         generator.subtypeIndices.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    generator.builder = (TypeBuilder)0x0;
    generator._1_7_ = 0;
    generator.subtypeIndices.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    generator.subtypeIndices.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&getRand._M_p);
    if (this->verbose == true) {
      printTypes(&this->types);
    }
    checkSubtypes(this);
    checkLUBs(this);
    checkCanonicalization(this);
    checkInhabitable(this);
    checkRecGroupShapes(this);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_48]._M_data)
              ((anon_class_1_0_00000001 *)&getRand._M_p,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&generator.supertypeIndices.
                   super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (generator.subtypeIndices.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(generator.subtypeIndices.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)generator.supertypeIndices.
                            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)generator.subtypeIndices.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&generator);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)local_98);
    if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  Fatal::Fatal((Fatal *)&getRand._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"Failed to build types: ",0x17);
  wasm::operator<<((ostream *)&local_218,local_58);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218," at index ",10);
  Fatal::operator<<((Fatal *)&getRand._M_p,
                    (unsigned_long *)
                    &generator.supertypeIndices.
                     super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Fatal::~Fatal((Fatal *)&getRand._M_p);
}

Assistant:

void Fuzzer::run(uint64_t seed) {
  // TODO: Reset the global type state to avoid monotonically increasing
  // memory use.
  RandEngine getRand(seed);
  std::cout << "Running with seed " << seed << "\n";

  // 4kb of random bytes should be enough for anyone!
  std::vector<char> bytes(4096);
  for (size_t i = 0; i < bytes.size(); i += sizeof(uint64_t)) {
    *(uint64_t*)(bytes.data() + i) = getRand();
  }
  rand = Random(std::move(bytes));

  // TODO: Options to control the size or set it randomly.
  HeapTypeGenerator generator =
    HeapTypeGenerator::create(rand, FeatureSet::All, 20);
  auto result = generator.builder.build();
  if (auto* err = result.getError()) {
    Fatal() << "Failed to build types: " << err->reason << " at index "
            << err->index;
  }
  types = std::move(*result);
  subtypeIndices = std::move(generator.subtypeIndices);

  if (verbose) {
    printTypes(types);
  }

  checkSubtypes();
  checkLUBs();
  checkCanonicalization();
  checkInhabitable();
  checkRecGroupShapes();
}